

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfuda_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::lfuda_cache(lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
              *this,size_t capacity,milliseconds dynamic_age_tick,float dynamic_age_ratio,
             float max_load_factor)

{
  size_type __n;
  iterator iVar1;
  allocator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_29;
  float local_28;
  float local_24;
  float max_load_factor_local;
  float dynamic_age_ratio_local;
  size_t capacity_local;
  lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  milliseconds dynamic_age_tick_local;
  
  local_28 = max_load_factor;
  local_24 = dynamic_age_ratio;
  _max_load_factor_local = capacity;
  capacity_local = (size_t)this;
  this_local = (lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)dynamic_age_tick.__r;
  mutex<(cappuccino::thread_safe)1,_std::mutex>::mutex(&this->m_lock);
  this->m_used_size = 0;
  (this->m_dynamic_age_tick).__r = (rep_conflict)this_local;
  this->m_dynamic_age_ratio = local_24;
  std::
  unordered_map<unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
  ::unordered_map(&this->m_keyed_elements);
  std::
  multimap<unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
  ::multimap(&this->m_lfu_list);
  __n = _max_load_factor_local;
  std::
  allocator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::allocator(&local_29);
  std::__cxx11::
  list<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::list(&this->m_dynamic_age_list,__n,&local_29);
  std::
  allocator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::~allocator(&local_29);
  std::
  _List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::_List_iterator(&this->m_open_list_end);
  iVar1 = std::__cxx11::
          list<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
          ::begin(&this->m_dynamic_age_list);
  (this->m_open_list_end)._M_node = iVar1._M_node;
  std::
  unordered_map<unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
  ::max_load_factor(&this->m_keyed_elements,local_28);
  std::
  unordered_map<unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
  ::reserve(&this->m_keyed_elements,_max_load_factor_local);
  return;
}

Assistant:

explicit lfuda_cache(
        size_t                    capacity,
        std::chrono::milliseconds dynamic_age_tick  = std::chrono::minutes{1},
        float                     dynamic_age_ratio = 0.5f,
        float                     max_load_factor   = 1.0f)
        : m_dynamic_age_tick(dynamic_age_tick),
          m_dynamic_age_ratio(dynamic_age_ratio),
          m_dynamic_age_list(capacity)
    {
        m_open_list_end = m_dynamic_age_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }